

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void initScene(scene_t *scene)

{
  GLuint *pGVar1;
  size_t __n;
  byte bVar2;
  char cVar3;
  uint n;
  yo_env *pyVar4;
  float *pfVar5;
  yo__vec2f yVar6;
  double dVar7;
  double dVar8;
  yo__vert v_00;
  yo__vert v_01;
  yo__vert v_02;
  _Alloc_hider _Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  GLuint GVar18;
  GLint GVar19;
  char *p;
  yo_scene *scene_00;
  yo__vhash *vhash;
  FILE *pFVar20;
  char *pcVar21;
  char *pcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  yo_scene *pyVar24;
  ulong uVar25;
  yo_texture *pyVar26;
  yo_camera *pyVar27;
  yo_shape *pyVar28;
  yo_material *pyVar29;
  vec3f *positions;
  void *pvVar30;
  vec3f *normal;
  void *__src;
  int *piVar31;
  int *sphcnt;
  float *LHbuffer;
  void *__n_00;
  void *__dest;
  undefined8 *puVar32;
  long lVar33;
  ulong uVar34;
  int t;
  char *pcVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  yo__vec3f *in_R8;
  long lVar39;
  float *in_R9;
  long lVar40;
  int iVar41;
  int i_1;
  long lVar42;
  int k;
  int j;
  long lVar43;
  size_t __nmemb;
  bool bVar44;
  yo__vec3f yVar45;
  yo_shape *local_4230;
  yo__vec3f *local_4218;
  yo__vec3f *local_4210;
  yo__vec2f *local_4208;
  yo__vert v_2;
  string local_4190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4150;
  FILE *local_4130;
  yo__vert v_1;
  yo__vert v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40e8;
  int *local_40c8;
  int *local_40c0;
  int *local_40b8;
  int *local_40b0;
  int *local_40a8;
  int *local_40a0;
  int *local_4098;
  int *local_4090;
  string local_4080;
  SphereTree hierarchy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4038;
  char *local_4018;
  char *pcStack_4010;
  char *local_4008;
  char *local_4000;
  char *local_3ff8;
  char *local_3ff0;
  char *pcStack_3fe8;
  char *local_3fe0;
  string N_ZEROS;
  string vert_head;
  
  load_sphere_hierarchy(&hierarchy,"../res/scene1/scene1.sph");
  buildLHcubemap("../res/null.shrgb");
  loadlut(3,&(scene->mesh).max_magn);
  build_sh_lut();
  iVar10 = upload_gamma(0xf);
  (scene->mesh).gammasize = iVar10;
  iVar10 = upload_sqrgamma(0xf);
  (scene->mesh).sqrgammasize = iVar10;
  github111116::ConsoleLogger::log<char[12],int>
            (&console,(char (*) [12])0x18cffe,&(scene->mesh).gammasize);
  github111116::ConsoleLogger::log<char[15],int>
            (&console,(char (*) [15])"sqrgamma size:",&(scene->mesh).sqrgammasize);
  github111116::ConsoleLogger::log<char[17]>(&console,(char (*) [17])"loading scene...");
  scene_00 = (yo_scene *)calloc(1,0x50);
  vhash = (yo__vhash *)calloc(1,0xc00008);
  local_4230 = (yo_shape *)calloc(1,0x60);
  scene_00->shapes = local_4230;
  scene_00->nshapes = 1;
  pFVar20 = fopen("../res/scene1/scene1.obj","rt");
  if (pFVar20 != (FILE *)0x0) {
    local_4208 = (yo__vec2f *)0x0;
    local_4210 = (yo__vec3f *)0x0;
    local_4218 = (yo__vec3f *)0x0;
    local_4130 = pFVar20;
    iVar17 = 0;
    iVar10 = 0;
    iVar41 = 0;
LAB_00157f1f:
    do {
      do {
        pFVar20 = local_4130;
        pcVar21 = fgets((char *)&vert_head,0x1000,local_4130);
        if (pcVar21 == (char *)0x0) {
          yo__flush_shape(scene_00,vhash);
          scene_00->nshapes = scene_00->nshapes + -1;
          fclose(pFVar20);
          uVar34 = 0;
          uVar37 = (ulong)(uint)scene_00->nshapes;
          if (scene_00->nshapes < 1) {
            uVar37 = uVar34;
          }
          for (; uVar34 != uVar37; uVar34 = uVar34 + 1) {
            pyVar28 = scene_00->shapes;
            pyVar28[uVar34].matid = -1;
            pcVar21 = pyVar28[uVar34].matname;
            if (pcVar21 != (char *)0x0) {
              uVar36 = 0;
              uVar25 = (ulong)(uint)scene_00->nmaterials;
              if (scene_00->nmaterials < 1) {
                uVar25 = uVar36;
              }
              iVar41 = 0;
              iVar10 = -1;
              while ((uVar25 * 0xe8 - uVar36 != 0 && (iVar10 < 0))) {
                iVar17 = yo__stricmp(*(char **)((long)scene_00->materials->ke + (uVar36 - 0xc)),
                                     pcVar21);
                if (iVar17 == 0) {
                  pyVar28[uVar34].matid = iVar41;
                  iVar10 = iVar41;
                }
                iVar41 = iVar41 + 1;
                uVar36 = uVar36 + 0xe8;
              }
            }
          }
          uVar34 = 0;
          uVar37 = (ulong)(uint)scene_00->nenvs;
          if (scene_00->nenvs < 1) {
            uVar37 = uVar34;
          }
          for (; uVar34 != uVar37; uVar34 = uVar34 + 1) {
            pyVar4 = scene_00->envs;
            pyVar4[uVar34].matid = -1;
            pcVar21 = pyVar4[uVar34].matname;
            if (pcVar21 != (char *)0x0) {
              uVar36 = 0;
              uVar25 = (ulong)(uint)scene_00->nmaterials;
              if (scene_00->nmaterials < 1) {
                uVar25 = uVar36;
              }
              iVar41 = 0;
              iVar10 = -1;
              while ((uVar25 * 0xe8 - uVar36 != 0 && (iVar10 < 0))) {
                iVar17 = yo__stricmp(*(char **)((long)scene_00->materials->ke + (uVar36 - 0xc)),
                                     pcVar21);
                if (iVar17 == 0) {
                  pyVar4[uVar34].matid = iVar41;
                  iVar10 = iVar41;
                }
                iVar41 = iVar41 + 1;
                uVar36 = uVar36 + 0xe8;
              }
            }
          }
          scene_00->ntextures = 0;
          scene_00->textures = (yo_texture *)0x0;
          for (lVar33 = 0; lVar33 < scene_00->nmaterials; lVar33 = lVar33 + 1) {
            pyVar29 = scene_00->materials;
            local_4038._M_dataplus._M_p = pyVar29[lVar33].ke_txt;
            local_4038._M_string_length = (size_type)pyVar29[lVar33].ka_txt;
            local_4038.field_2._M_allocated_capacity = (size_type)pyVar29[lVar33].kd_txt;
            local_4038.field_2._8_8_ = pyVar29[lVar33].ks_txt;
            local_4018 = pyVar29[lVar33].kr_txt;
            pcStack_4010 = pyVar29[lVar33].kt_txt;
            local_4008 = pyVar29[lVar33].ns_txt;
            local_4000 = pyVar29[lVar33].op_txt;
            local_3ff8 = pyVar29[lVar33].op_txt;
            local_3ff0 = pyVar29[lVar33].ior_txt;
            pcStack_3fe8 = pyVar29[lVar33].bump_txt;
            local_3fe0 = pyVar29[lVar33].disp_txt;
            local_40e8._M_dataplus._M_p = (pointer)&pyVar29[lVar33].ke_txtid;
            local_40e8._M_string_length = (size_type)&pyVar29[lVar33].ka_txtid;
            local_40e8.field_2._M_allocated_capacity = (size_type)&pyVar29[lVar33].kd_txtid;
            local_40e8.field_2._8_8_ = &pyVar29[lVar33].ks_txtid;
            local_40c8 = &pyVar29[lVar33].kr_txtid;
            local_40c0 = &pyVar29[lVar33].kt_txtid;
            local_40b8 = &pyVar29[lVar33].ns_txtid;
            local_40b0 = &pyVar29[lVar33].op_txtid;
            local_40a8 = &pyVar29[lVar33].op_txtid;
            local_40a0 = &pyVar29[lVar33].ior_txtid;
            local_4098 = &pyVar29[lVar33].bump_txtid;
            local_4090 = &pyVar29[lVar33].disp_txtid;
            for (lVar43 = 0; lVar43 != 0xc; lVar43 = lVar43 + 1) {
              pcVar21 = (&local_4038._M_dataplus)[lVar43]._M_p;
              uVar37 = 0xffffffffffffffff;
              iVar10 = -1;
              if (pcVar21 != (char *)0x0) {
                iVar41 = scene_00->ntextures;
                lVar42 = 0;
                uVar34 = 0;
                for (; (iVar10 = (int)uVar37, (long)uVar34 < (long)iVar41 && (iVar10 < 0));
                    uVar37 = uVar37 & 0xffffffff) {
                  iVar10 = strcmp(pcVar21,*(char **)((long)&scene_00->textures->path + lVar42));
                  if (iVar10 == 0) {
                    uVar37 = uVar34;
                  }
                  uVar34 = uVar34 + 1;
                  lVar42 = lVar42 + 0x20;
                }
                if (iVar10 < 0) {
                  if (iVar41 == 0) {
                    pyVar26 = scene_00->textures;
                    iVar10 = 1;
LAB_00158c32:
                    pyVar26 = (yo_texture *)realloc(pyVar26,(long)iVar10 << 5);
                    scene_00->textures = pyVar26;
                    iVar10 = scene_00->ntextures;
                    iVar17 = iVar10 + 1;
                    iVar41 = yo__vector_capacity(iVar17);
                    memset(pyVar26 + iVar10,0,(long)(iVar41 - iVar10) << 5);
                  }
                  else {
                    iVar17 = iVar41 + 1;
                    iVar10 = yo__vector_capacity(iVar17);
                    iVar41 = yo__vector_capacity(iVar41);
                    pyVar26 = scene_00->textures;
                    if (iVar41 < iVar10) goto LAB_00158c32;
                  }
                  scene_00->ntextures = iVar17;
                  pcVar21 = yo__strdup(pcVar21);
                  pyVar26[(long)iVar17 + -1].path = pcVar21;
                  iVar10 = scene_00->ntextures + -1;
                }
              }
              *(int *)(&local_40e8._M_dataplus)[lVar43]._M_p = iVar10;
            }
          }
          for (lVar33 = 0x80001; lVar33 != 0x180001; lVar33 = lVar33 + 1) {
            free(*(void **)(vhash->s + lVar33 * 2 + -1));
          }
          free(vhash);
          free(local_4218);
          free(local_4210);
          free(local_4208);
          if (scene_00->cameras != (yo_camera *)0x0) {
            pyVar27 = (yo_camera *)realloc(scene_00->cameras,(long)scene_00->ncameras * 0x38);
            scene_00->cameras = pyVar27;
          }
          if (scene_00->shapes != (yo_shape *)0x0) {
            pyVar28 = (yo_shape *)realloc(scene_00->shapes,(long)scene_00->nshapes * 0x60);
            scene_00->shapes = pyVar28;
          }
          if (scene_00->materials != (yo_material *)0x0) {
            pyVar29 = (yo_material *)realloc(scene_00->materials,(long)scene_00->nmaterials * 0xe8);
            scene_00->materials = pyVar29;
          }
          if (scene_00->textures != (yo_texture *)0x0) {
            pyVar26 = (yo_texture *)realloc(scene_00->textures,(long)scene_00->ntextures << 5);
            scene_00->textures = pyVar26;
          }
          if (scene_00->nshapes != 0) {
            github111116::ConsoleLogger::log<int,char[7]>
                      (&console,(int *)scene_00,(char (*) [7])"shapes");
            (scene->mesh).vertices = 0;
            n = scene_00->nshapes;
            lVar33 = 0;
            uVar37 = 0;
            if (0 < (int)n) {
              uVar37 = (ulong)n;
            }
            iVar10 = 0;
            for (; uVar37 * 0x60 - lVar33 != 0; lVar33 = lVar33 + 0x60) {
              iVar10 = iVar10 + *(int *)((long)&scene_00->shapes->nelems + lVar33) * 3;
              (scene->mesh).vertices = iVar10;
            }
            upload_albedo_map(n,texture_file_abi_cxx11_);
            __nmemb = (size_t)(scene->mesh).vertices;
            positions = (vec3f *)calloc(__nmemb,0xc);
            pvVar30 = calloc(__nmemb,8);
            normal = (vec3f *)calloc(__nmemb,0xc);
            __src = calloc(__nmemb,4);
            piVar31 = (int *)calloc(__nmemb,4);
            sphcnt = (int *)calloc(__nmemb,4);
            LHbuffer = (float *)calloc(__nmemb,900);
            __n_00 = (void *)(__nmemb * 0xc);
            __n = __nmemb * 4;
            iVar10 = 0;
            iVar41 = 0;
            while( true ) {
              N_ZEROS._M_dataplus._M_p._0_4_ = iVar10;
              if (scene_00->nshapes <= iVar10) break;
              lVar43 = (long)iVar10;
              pyVar28 = scene_00->shapes;
              lVar33 = lVar43;
              if ((enable_texture[lVar43] == true) && (pyVar28[lVar43].texcoord == (float *)0x0)) {
                github111116::ConsoleLogger::error<char[6],int,char[39]>
                          (&console,(char (*) [6])"Shape",(int *)&N_ZEROS,
                           (char (*) [39])"is texture-enabled but has no texcoord");
                lVar33 = (long)(int)N_ZEROS._M_dataplus._M_p;
                iVar10 = (int)N_ZEROS._M_dataplus._M_p;
              }
              lVar38 = (long)iVar41;
              lVar42 = lVar38 * 0xc;
              for (lVar39 = 0; lVar40 = (long)pyVar28[lVar43].nelems * 3, lVar39 < lVar40;
                  lVar39 = lVar39 + 1) {
                pfVar5 = pyVar28[lVar43].pos;
                iVar17 = pyVar28[lVar43].elem[lVar39];
                *(float *)((long)&positions->z + lVar42) = pfVar5[(long)iVar17 * 3 + 2];
                *(undefined8 *)((long)&positions->x + lVar42) =
                     *(undefined8 *)(pfVar5 + (long)iVar17 * 3);
                pfVar5 = pyVar28[lVar43].norm;
                lVar40 = (long)pyVar28[lVar43].elem[lVar39];
                *(float *)((long)&normal->z + lVar42) = pfVar5[lVar40 * 3 + 2];
                *(undefined8 *)((long)&normal->x + lVar42) = *(undefined8 *)(pfVar5 + lVar40 * 3);
                if (enable_texture[lVar33] == true) {
                  *(undefined8 *)((long)pvVar30 + lVar39 * 8 + lVar38 * 8) =
                       *(undefined8 *)(pyVar28[lVar43].texcoord + lVar40 * 2);
                }
                else {
                  *(undefined8 *)((long)pvVar30 + lVar39 * 8 + lVar38 * 8) = 0xbf800000bf800000;
                }
                *(int *)((long)__src + lVar39 * 4 + lVar38 * 4) = iVar10;
                lVar42 = lVar42 + 0xc;
              }
              iVar41 = (int)lVar40 + iVar41;
              iVar10 = iVar10 + 1;
            }
            lVar33 = 0;
            for (lVar43 = 0; lVar43 < scene_00->ncameras; lVar43 = lVar43 + 1) {
              free(*(void **)((long)scene_00->cameras->from + lVar33 + -8));
              lVar33 = lVar33 + 0x38;
            }
            lVar33 = 0x40;
            for (lVar43 = 0; lVar43 < scene_00->nshapes; lVar43 = lVar43 + 1) {
              pyVar28 = scene_00->shapes;
              free(*(void **)((long)pyVar28 + lVar33 + -0x40));
              free(*(void **)((long)pyVar28 + lVar33 + -0x30));
              free(*(void **)((long)pyVar28 + lVar33 + -0x20));
              free(*(void **)((long)pyVar28 + lVar33 + -0x10));
              free(*(void **)((long)pyVar28 + lVar33 + -8));
              free(*(void **)((long)&pyVar28->name + lVar33));
              lVar33 = lVar33 + 0x60;
            }
            for (lVar33 = 0; lVar33 < scene_00->nmaterials; lVar33 = lVar33 + 1) {
              pyVar29 = scene_00->materials;
              free(pyVar29[lVar33].name);
              N_ZEROS._M_dataplus._M_p = pyVar29[lVar33].ke_txt;
              N_ZEROS._M_string_length = (size_type)(&pyVar29[lVar33].ke_txt)[1];
              N_ZEROS.field_2._M_allocated_capacity = (size_type)pyVar29[lVar33].kd_txt;
              N_ZEROS.field_2._8_8_ = (&pyVar29[lVar33].kd_txt)[1];
              for (lVar43 = 0; lVar43 != 10; lVar43 = lVar43 + 1) {
                free((&N_ZEROS._M_dataplus)[lVar43]._M_p);
              }
            }
            lVar33 = 8;
            for (lVar43 = 0; lVar43 < scene_00->nenvs; lVar43 = lVar43 + 1) {
              pyVar4 = scene_00->envs;
              free(*(void **)((long)pyVar4->from + lVar33 + -0x1c));
              free(*(void **)((long)pyVar4->from + lVar33 + -0x14));
              lVar33 = lVar33 + 0x38;
            }
            lVar33 = 0;
            for (lVar43 = 0; lVar43 < scene_00->ntextures; lVar43 = lVar43 + 1) {
              pyVar26 = scene_00->textures;
              free(*(void **)((long)&pyVar26->path + lVar33));
              free(*(void **)((long)&pyVar26->pixels + lVar33));
              lVar33 = lVar33 + 0x20;
            }
            cluster_points((scene->mesh).vertices,positions,piVar31);
            cluster_preprocess((scene->mesh).vertices,positions,piVar31,&hierarchy,sphcnt);
            calculateLH((scene->mesh).vertices,positions,normal,LHbuffer,"../res/scene1/light7.obj")
            ;
            uploadLH((scene->mesh).vertices,LHbuffer);
            github111116::ConsoleLogger::log<char[25]>
                      (&console,(char (*) [25])"renderer initializing...");
            pGVar1 = &(scene->mesh).vao;
            (*glad_glGenVertexArrays)(1,pGVar1);
            (*glad_glBindVertexArray)(*pGVar1);
            pGVar1 = &(scene->mesh).vbo;
            (*glad_glGenBuffers)(1,pGVar1);
            (*glad_glBindBuffer)(0x8892,*pGVar1);
            (*glad_glBufferData)(0x8892,__nmemb * 0x2c,(void *)0x0,0x88e4);
            __dest = (*glad_glMapBuffer)(0x8892,0x88b9);
            if (__dest == (void *)0x0) {
              __assert_fail("buffer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/main.cpp"
                            ,0xbd,"void initScene(scene_t *)");
            }
            memcpy(__dest,positions,(size_t)__n_00);
            memcpy((void *)((long)__dest + (long)__n_00),pvVar30,__nmemb * 8);
            pvVar30 = (void *)((long)__dest + (long)__n_00 + __nmemb * 8);
            memcpy(pvVar30,normal,(size_t)__n_00);
            pvVar30 = (void *)((long)pvVar30 + (long)__n_00);
            memcpy(pvVar30,__src,__n);
            pvVar30 = (void *)((long)pvVar30 + __n);
            memcpy(pvVar30,piVar31,__n);
            memcpy((void *)((long)pvVar30 + __n),sphcnt,__n);
            (*glad_glUnmapBuffer)(0x8892);
            (*glad_glEnableVertexAttribArray)(0);
            (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
            (*glad_glEnableVertexAttribArray)(1);
            (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0,__n_00);
            (*glad_glEnableVertexAttribArray)(2);
            (*glad_glVertexAttribPointer)(2,3,0x1406,'\0',0,(void *)(__nmemb * 0x14));
            (*glad_glEnableVertexAttribArray)(3);
            (*glad_glVertexAttribIPointer)(3,1,0x1404,0,(void *)(__nmemb << 5));
            (*glad_glEnableVertexAttribArray)(4);
            (*glad_glVertexAttribIPointer)(4,1,0x1404,0,(void *)(__nmemb * 0x24));
            (*glad_glEnableVertexAttribArray)(5);
            (*glad_glVertexAttribIPointer)(5,1,0x1404,0,(void *)(__nmemb * 0x28));
            free(positions);
            free(normal);
            free(__src);
            free(piVar31);
            free(sphcnt);
            free(LHbuffer);
            std::__cxx11::string::string((string *)&N_ZEROS,"0",(allocator *)&vert_head);
            iVar10 = 0xe0;
            while (bVar44 = iVar10 != 0, iVar10 = iVar10 + -1, bVar44) {
              std::operator+(&vert_head,&N_ZEROS,",0");
              std::__cxx11::string::operator=((string *)&N_ZEROS,(string *)&vert_head);
              std::__cxx11::string::~string((string *)&vert_head);
            }
            std::__cxx11::to_string(&local_4190,0xf);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1
                           ,"#version 410 core\n#define sh_order ",&local_4190);
            std::operator+(&local_4170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1
                           ,"\n#define N ");
            std::__cxx11::to_string(&local_4080,0xe1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           &local_4170,&local_4080);
            std::operator+(&local_4150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           "\n#define N_ZEROS ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_2
                           ,&local_4150,&N_ZEROS);
            std::operator+(&local_40e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_2
                           ,"\n#define SHEXP_METHOD ");
            std::operator+(&local_4038,&local_40e8,"shexp_HYB");
            std::operator+(&vert_head,&local_4038,"\n");
            std::__cxx11::string::~string((string *)&local_4038);
            std::__cxx11::string::~string((string *)&local_40e8);
            std::__cxx11::string::~string((string *)&v_2);
            std::__cxx11::string::~string((string *)&local_4150);
            std::__cxx11::string::~string((string *)&v);
            std::__cxx11::string::~string((string *)&local_4080);
            std::__cxx11::string::~string((string *)&local_4170);
            std::__cxx11::string::~string((string *)&v_1);
            std::__cxx11::string::~string((string *)&local_4190);
            readfile_abi_cxx11_(&local_40e8,"../shaders/vert.glsl");
            std::operator+(&local_4038,&vert_head,&local_40e8);
            _Var9._M_p = local_4038._M_dataplus._M_p;
            readfile_abi_cxx11_((string *)&v_2,"../shaders/frag.glsl");
            GVar18 = s_loadProgram(_Var9._M_p,(char *)v_2._0_8_,&PTR_anon_var_dwarf_3626b_001aeaa0,6
                                  );
            (scene->mesh).program = GVar18;
            std::__cxx11::string::~string((string *)&v_2);
            std::__cxx11::string::~string((string *)&local_4038);
            std::__cxx11::string::~string((string *)&local_40e8);
            GVar18 = (scene->mesh).program;
            if (GVar18 == 0) {
              puVar32 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar32 = "Error loading mesh shader";
              __cxa_throw(puVar32,&char_const*::typeinfo,0);
            }
            GVar19 = (*glad_glGetUniformLocation)(GVar18,"u_view");
            (scene->mesh).u_view = GVar19;
            GVar19 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_projection");
            (scene->mesh).u_projection = GVar19;
            std::__cxx11::string::~string((string *)&vert_head);
            std::__cxx11::string::~string((string *)&N_ZEROS);
            std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&hierarchy.child);
            return;
          }
          goto LAB_001596bd;
        }
        iVar11 = yo__splitws((char *)&vert_head,(char **)&N_ZEROS,0x400);
        _Var9 = N_ZEROS._M_dataplus;
      } while (iVar11 == 0);
      bVar2 = *N_ZEROS._M_dataplus._M_p;
      if (bVar2 - 99 < 0x16) {
        lVar33 = (long)iVar11;
        switch((uint)bVar2) {
        case 99:
        case 0x65:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') goto LAB_00157f1f;
          break;
        case 0x66:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') {
            if (local_4230->etype != 3) {
              local_4230 = yo__flush_shape(scene_00,vhash);
            }
            local_4230->etype = 3;
            iVar11 = 0;
            for (uVar37 = 1; (long)uVar37 < lVar33; uVar37 = uVar37 + 1) {
              local_4150._M_string_length._4_4_ = 0;
              local_4150.field_2._M_allocated_capacity._0_4_ = 0;
              local_4150.field_2._M_allocated_capacity._4_4_ = 0;
              local_4150._M_dataplus._M_p._0_4_ = iVar10;
              local_4150._M_dataplus._M_p._4_4_ = iVar17;
              local_4150._M_string_length._0_4_ = iVar41;
              yo__parse_vert(&v_2,(&N_ZEROS._M_dataplus)[uVar37]._M_p,vhash,
                             (yo__vert)ZEXT1224(CONCAT48(iVar41,CONCAT44(iVar17,iVar10))));
              v_02.vid = v_2.vid;
              v_02.radius = v_2.radius;
              v_02.norm = v_2.norm;
              v_02.color = v_2.color;
              v_02.pos = v_2.pos;
              v_02.texcoord = v_2.texcoord;
              yo__add_shape_vert(local_4230,v_02,local_4218,local_4210,local_4208,in_R8,in_R9);
              iVar16 = v_2.vid;
              iVar15 = iVar11;
              if (uVar37 == 1) {
                iVar15 = v_2.vid;
              }
              iVar13 = local_4230->nelems;
              if (3 < uVar37) {
                lVar43 = (long)iVar13;
                piVar31 = local_4230->elem;
                iVar14 = piVar31[lVar43 + -1];
                iVar12 = 1;
                if (iVar13 == 0) {
LAB_00158401:
                  piVar31 = (int *)realloc(piVar31,(long)iVar12 << 2);
                  local_4230->elem = piVar31;
                  lVar43 = (long)local_4230->nelems;
                }
                else {
                  iVar12 = yo__vector_capacity(iVar13 + 1);
                  iVar13 = yo__vector_capacity(iVar13);
                  if (iVar13 < iVar12) goto LAB_00158401;
                }
                piVar31[lVar43] = iVar11;
                iVar11 = local_4230->nelems;
                local_4230->nelems = iVar11 + 1;
                iVar13 = yo__vector_capacity(iVar11 + 2);
                iVar11 = iVar11 + 1;
                if ((iVar11 == 0) || (iVar12 = yo__vector_capacity(iVar11), iVar12 < iVar13)) {
                  piVar31 = (int *)realloc(piVar31,(long)iVar13 << 2);
                  local_4230->elem = piVar31;
                  iVar11 = local_4230->nelems;
                }
                piVar31[iVar11] = iVar14;
                iVar13 = local_4230->nelems + 1;
                local_4230->nelems = iVar13;
              }
              if (iVar13 == 0) {
                piVar31 = local_4230->elem;
                iVar11 = 1;
LAB_001584e6:
                piVar31 = (int *)realloc(piVar31,(long)iVar11 << 2);
                local_4230->elem = piVar31;
                iVar13 = local_4230->nelems;
              }
              else {
                iVar11 = yo__vector_capacity(iVar13 + 1);
                iVar14 = yo__vector_capacity(iVar13);
                piVar31 = local_4230->elem;
                if (iVar14 < iVar11) goto LAB_001584e6;
              }
              piVar31[iVar13] = iVar16;
              local_4230->nelems = local_4230->nelems + 1;
              iVar11 = iVar15;
            }
            goto LAB_00157f1f;
          }
          break;
        case 0x67:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') {
            local_4230 = yo__flush_shape(scene_00,vhash);
            pcVar21 = (char *)N_ZEROS._M_string_length;
            if (iVar11 < 2) {
              pcVar21 = (char *)0x0;
            }
            pcVar21 = yo__strdup(pcVar21);
            local_4230->groupname = pcVar21;
            goto LAB_00157f1f;
          }
          break;
        case 0x6c:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') {
            if (local_4230->etype != 2) {
              local_4230 = yo__flush_shape(scene_00,vhash);
            }
            local_4230->etype = 2;
            for (uVar37 = 1; (long)uVar37 < lVar33; uVar37 = uVar37 + 1) {
              local_4170._M_string_length._4_4_ = 0;
              local_4170.field_2._M_allocated_capacity._0_4_ = 0;
              local_4170.field_2._M_allocated_capacity._4_4_ = 0;
              local_4170._M_dataplus._M_p._0_4_ = iVar10;
              local_4170._M_dataplus._M_p._4_4_ = iVar17;
              local_4170._M_string_length._0_4_ = iVar41;
              yo__parse_vert(&v,(&N_ZEROS._M_dataplus)[uVar37]._M_p,vhash,
                             (yo__vert)ZEXT1224(CONCAT48(iVar41,CONCAT44(iVar17,iVar10))));
              v_00.vid = v.vid;
              v_00.radius = v.radius;
              v_00.norm = v.norm;
              v_00.color = v.color;
              v_00.pos = v.pos;
              v_00.texcoord = v.texcoord;
              yo__add_shape_vert(local_4230,v_00,local_4218,local_4210,local_4208,in_R8,in_R9);
              iVar11 = local_4230->nelems;
              if (2 < uVar37) {
                lVar43 = (long)iVar11;
                piVar31 = local_4230->elem;
                iVar16 = piVar31[lVar43 + -1];
                iVar15 = 1;
                if (iVar11 == 0) {
LAB_001580c5:
                  piVar31 = (int *)realloc(piVar31,(long)iVar15 << 2);
                  local_4230->elem = piVar31;
                  lVar43 = (long)local_4230->nelems;
                }
                else {
                  iVar15 = yo__vector_capacity(iVar11 + 1);
                  iVar11 = yo__vector_capacity(iVar11);
                  if (iVar11 < iVar15) goto LAB_001580c5;
                }
                piVar31[lVar43] = iVar16;
                iVar11 = local_4230->nelems + 1;
                local_4230->nelems = iVar11;
              }
              if (iVar11 == 0) {
                piVar31 = local_4230->elem;
                iVar16 = 1;
LAB_0015813b:
                piVar31 = (int *)realloc(piVar31,(long)iVar16 << 2);
                local_4230->elem = piVar31;
                iVar11 = local_4230->nelems;
              }
              else {
                iVar16 = yo__vector_capacity(iVar11 + 1);
                iVar15 = yo__vector_capacity(iVar11);
                piVar31 = local_4230->elem;
                if (iVar15 < iVar16) goto LAB_0015813b;
              }
              piVar31[iVar11] = v.vid;
              local_4230->nelems = local_4230->nelems + 1;
            }
            goto LAB_00157f1f;
          }
          break;
        case 0x6f:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') {
            local_4230 = yo__flush_shape(scene_00,vhash);
            pcVar21 = (char *)N_ZEROS._M_string_length;
            if (iVar11 < 2) {
              pcVar21 = (char *)0x0;
            }
            pcVar21 = yo__strdup(pcVar21);
            local_4230->name = pcVar21;
            goto LAB_00157f1f;
          }
          break;
        case 0x70:
          if (N_ZEROS._M_dataplus._M_p[1] == '\0') {
            if (local_4230->etype != 1) {
              local_4230 = yo__flush_shape(scene_00,vhash);
            }
            local_4230->etype = 1;
            for (lVar43 = 1; lVar43 < lVar33; lVar43 = lVar43 + 1) {
              local_4190._M_string_length._4_4_ = 0;
              local_4190.field_2._M_allocated_capacity._0_4_ = 0;
              local_4190.field_2._M_allocated_capacity._4_4_ = 0;
              local_4190._M_dataplus._M_p._0_4_ = iVar10;
              local_4190._M_dataplus._M_p._4_4_ = iVar17;
              local_4190._M_string_length._0_4_ = iVar41;
              yo__parse_vert(&v_1,(&N_ZEROS._M_dataplus)[lVar43]._M_p,vhash,
                             (yo__vert)ZEXT1224(CONCAT48(iVar41,CONCAT44(iVar17,iVar10))));
              v_01.vid = v_1.vid;
              v_01.radius = v_1.radius;
              v_01.norm = v_1.norm;
              v_01.color = v_1.color;
              v_01.pos = v_1.pos;
              v_01.texcoord = v_1.texcoord;
              yo__add_shape_vert(local_4230,v_01,local_4218,local_4210,local_4208,in_R8,in_R9);
              iVar11 = local_4230->nelems;
              iVar16 = 1;
              if (iVar11 == 0) {
LAB_00158270:
                piVar31 = (int *)realloc(local_4230->elem,(long)iVar16 << 2);
                local_4230->elem = piVar31;
                iVar11 = local_4230->nelems;
              }
              else {
                iVar16 = yo__vector_capacity(iVar11 + 1);
                iVar15 = yo__vector_capacity(iVar11);
                if (iVar15 < iVar16) goto LAB_00158270;
                piVar31 = local_4230->elem;
              }
              piVar31[iVar11] = v_1.vid;
              local_4230->nelems = local_4230->nelems + 1;
            }
            goto LAB_00157f1f;
          }
          break;
        case 0x76:
          cVar3 = N_ZEROS._M_dataplus._M_p[1];
          if (cVar3 == 't') {
            if (N_ZEROS._M_dataplus._M_p[2] != '\0') break;
            dVar7 = atof((char *)N_ZEROS._M_string_length);
            dVar8 = atof((char *)N_ZEROS.field_2._M_allocated_capacity);
            iVar11 = 1;
            iVar16 = 1;
            if (iVar17 == 0) {
LAB_00158810:
              local_4208 = (yo__vec2f *)realloc(local_4208,(long)iVar16 << 3);
            }
            else {
              iVar11 = iVar17 + 1;
              iVar16 = yo__vector_capacity(iVar11);
              iVar15 = yo__vector_capacity(iVar17);
              if (iVar15 < iVar16) goto LAB_00158810;
            }
            yVar6.y = (float)dVar8;
            yVar6.x = (float)dVar7;
            local_4208[iVar17] = yVar6;
            iVar17 = iVar11;
          }
          else if (cVar3 == 'c') {
LAB_00158609:
            if (N_ZEROS._M_dataplus._M_p[2] != '\0') break;
          }
          else if (cVar3 == 'n') {
            if (N_ZEROS._M_dataplus._M_p[2] != '\0') break;
            yVar45 = yo__parse_float3((char **)&N_ZEROS._M_string_length);
            iVar11 = 1;
            iVar16 = 1;
            if (iVar41 == 0) {
LAB_0015879f:
              local_4210 = (yo__vec3f *)realloc(local_4210,(long)iVar16 * 0xc);
            }
            else {
              iVar11 = iVar41 + 1;
              iVar16 = yo__vector_capacity(iVar11);
              iVar15 = yo__vector_capacity(iVar41);
              if (iVar15 < iVar16) goto LAB_0015879f;
            }
            local_4210[iVar41].x = (float)(int)yVar45._0_8_;
            local_4210[iVar41].y = (float)(int)((ulong)yVar45._0_8_ >> 0x20);
            local_4210[iVar41].z = yVar45.z;
            iVar41 = iVar11;
          }
          else {
            if (cVar3 == 'r') goto LAB_00158609;
            if (cVar3 != '\0') break;
            yVar45 = yo__parse_float3((char **)&N_ZEROS._M_string_length);
            iVar11 = 1;
            iVar16 = 1;
            if (iVar10 == 0) {
LAB_001585f3:
              local_4218 = (yo__vec3f *)realloc(local_4218,(long)iVar16 * 0xc);
            }
            else {
              iVar11 = iVar10 + 1;
              iVar16 = yo__vector_capacity(iVar11);
              iVar15 = yo__vector_capacity(iVar10);
              if (iVar15 < iVar16) goto LAB_001585f3;
            }
            local_4218[iVar10].x = (float)(int)yVar45._0_8_;
            local_4218[iVar10].y = (float)(int)((ulong)yVar45._0_8_ >> 0x20);
            local_4218[iVar10].z = yVar45.z;
            iVar10 = iVar11;
          }
          goto LAB_00157f1f;
        case 0x78:
          if (N_ZEROS._M_dataplus._M_p[1] == 'f') goto LAB_00158609;
        }
      }
      else if (bVar2 == 0x23) goto LAB_00157f1f;
      iVar16 = strcmp(N_ZEROS._M_dataplus._M_p,"usemtl");
      if (iVar16 == 0) {
        local_4230 = yo__flush_shape(scene_00,vhash);
        pcVar21 = (char *)N_ZEROS._M_string_length;
        if (iVar11 < 2) {
          pcVar21 = (char *)0x0;
        }
        pcVar21 = yo__strdup(pcVar21);
        local_4230->matname = pcVar21;
        goto LAB_00157f1f;
      }
      iVar11 = strcmp(_Var9._M_p,"mtllib");
      if (iVar11 != 0) goto LAB_00157f1f;
      pcVar21 = (char *)0x0;
      for (pcVar22 = "../res/scene1/scene1.obj";
          ((cVar3 = *pcVar22, pcVar35 = pcVar22, cVar3 == '/' || (cVar3 == '\\')) ||
          (pcVar35 = pcVar21, cVar3 != '\0')); pcVar22 = pcVar22 + 1) {
        pcVar21 = pcVar35;
      }
      pbVar23 = &local_4038;
      if (pcVar21 != (char *)0x0) {
        strncpy((char *)&local_4038,"../res/scene1/scene1.obj",(size_t)(pcVar21 + -0x18882f));
        pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (&stack0xffffffffffe73799 + (long)pcVar21);
      }
      *(char *)&(pbVar23->_M_dataplus)._M_p = '\0';
      strcat((char *)&local_4038,(char *)N_ZEROS._M_string_length);
      pyVar24 = yo__load_mtl(scene_00,(char *)&local_4038);
      if (pyVar24 == (yo_scene *)0x0) {
        fwrite("yocto: ERROR loading material\n",0x1e,1,_stderr);
      }
      pyVar24 = yo__load_mtl(scene_00,(char *)&local_4038);
    } while (pyVar24 != (yo_scene *)0x0);
  }
LAB_001596bd:
  puVar32 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar32 = "Error loading obj file";
  __cxa_throw(puVar32,&char_const*::typeinfo,0);
}

Assistant:

static void initScene(scene_t *scene)
{
	SphereTree hierarchy = load_sphere_hierarchy(sphere_file);
	buildLHcubemap(sh_light_file);
	loadlut(3, scene->mesh.max_magn);
	build_sh_lut();
	scene->mesh.gammasize = upload_gamma(shorder);
	scene->mesh.sqrgammasize = upload_sqrgamma(shorder);
	console.log("gamma size:", scene->mesh.gammasize);
	console.log("sqrgamma size:", scene->mesh.sqrgammasize);

	// mesh
	console.log("loading scene...");
	yo_scene *yo = yo_load_obj(obj_file, true, false);
	if (!yo || !yo->nshapes)
		throw "Error loading obj file";
	console.log(yo->nshapes, "shapes");

	scene->mesh.vertices = 0;
	for (int i = 0; i < yo->nshapes; i++)
		scene->mesh.vertices += yo->shapes[i].nelems * 3;

	// load model texture
	upload_albedo_map(yo->nshapes, texture_file);

	// alloc host space for attributes
	m_vec3 *positions = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	m_vec2 *texcoords = (m_vec2*)calloc(scene->mesh.vertices, sizeof(m_vec2));
	m_vec3 *normals   = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	int *objids       = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *clusterids   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *sphcnt   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	// Note: LH isn't uploaded as vertex attribute
	float *LH = (float*)calloc(scene->mesh.vertices, N_COEFFS * sizeof(float));
	// total size of each attribute
	size_t positionsSize  = scene->mesh.vertices * sizeof(m_vec3);
	size_t texcoordsSize  = scene->mesh.vertices * sizeof(m_vec2);
	size_t normalsSize    = scene->mesh.vertices * sizeof(m_vec3);
	size_t objidsSize     = scene->mesh.vertices * sizeof(int);
	size_t clusteridsSize = scene->mesh.vertices * sizeof(int);
	size_t sphcntSize     = scene->mesh.vertices * sizeof(int);
	size_t LHSize         = scene->mesh.vertices * N_COEFFS * sizeof(float);

	// fill positions & normals from scene
	int n = 0;
	for (int i = 0; i < yo->nshapes; i++)
	{
		yo_shape *shape = yo->shapes + i;
		if (enable_texture[i] && !shape->texcoord)
			console.error("Shape",i,"is texture-enabled but has no texcoord");
		for (int j = 0; j < shape->nelems * 3; j++)
		{
			positions[n + j] = *(m_vec3*)&shape->pos[shape->elem[j] * 3];
			normals[n + j] = *(m_vec3*)&shape->norm[shape->elem[j] * 3];
			if (enable_texture[i])
				texcoords[n + j] = *(m_vec2*)&shape->texcoord[shape->elem[j] * 2];
			else
				texcoords[n + j] = m_vec2{-1,-1};
			objids[n + j] = i;
		}
		n += shape->nelems * 3;
	}
	yo_free_scene(yo);
	// cluster receiver
	cluster_points(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids);
	cluster_preprocess(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids, hierarchy, sphcnt);
	// preprocess lighting
	if (obj_light_enabled)
		calculateLH(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), reinterpret_cast<vec3f*>(normals), LH, obj_light_file);
	else
		memset(LH, 0, LHSize);
	// because openGL doesn't support array as attribute, we upload it as texture
	uploadLH(scene->mesh.vertices, LH);

	console.log("renderer initializing...");
	// upload geometry to opengl
	glGenVertexArrays(1, &scene->mesh.vao);
	glBindVertexArray(scene->mesh.vao);
	// upload attribute data
	glGenBuffers(1, &scene->mesh.vbo);
	glBindBuffer(GL_ARRAY_BUFFER, scene->mesh.vbo);
	glBufferData(GL_ARRAY_BUFFER, positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize, NULL, GL_STATIC_DRAW);
	unsigned char *buffer = (unsigned char*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	assert(buffer);
	memcpy(buffer, positions, positionsSize);
	memcpy(buffer + positionsSize, texcoords, texcoordsSize);
	memcpy(buffer + positionsSize + texcoordsSize, normals, normalsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize, objids, objidsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize, clusterids, clusteridsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize, sphcnt, sphcntSize);
	glUnmapBuffer(GL_ARRAY_BUFFER);

	// set attribute pointers
	glEnableVertexAttribArray(0);
	glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, (void*)0);
	glEnableVertexAttribArray(1);
	glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, (void*)positionsSize);
	glEnableVertexAttribArray(2);
	glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, 0, (void*)(positionsSize + texcoordsSize));
	glEnableVertexAttribArray(3);
	glVertexAttribIPointer(3, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize));
	glEnableVertexAttribArray(4);
	glVertexAttribIPointer(4, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize));
	glEnableVertexAttribArray(5);
	glVertexAttribIPointer(5, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize));

	// free host space
	free(positions);
	free(normals);
	free(objids);
	free(clusterids);
	free(sphcnt);
	free(LH);

	const char *attribs[] =
	{
		"a_position",
		"a_texcoord",
		"a_normal",
		"a_objid",
		"a_clusterid",
		"a_sphcnt"
	};
	std::string N_ZEROS = "0";
	for (int i=1; i<N_COEFFS; ++i)
		N_ZEROS = N_ZEROS + ",0";
	std::string vert_head = "#version 410 core\n"
	"#define sh_order " + std::to_string(shorder) + "\n"
	"#define N " + std::to_string(shorder * shorder) + "\n"
	"#define N_ZEROS " + N_ZEROS + "\n"
	"#define SHEXP_METHOD " + SHEXP_METHOD + "\n";
	scene->mesh.program = s_loadProgram((vert_head + readfile(vert_shader_path)).c_str(), readfile(frag_shader_path).c_str(), attribs, 6);
	if (!scene->mesh.program)
		throw "Error loading mesh shader";
	scene->mesh.u_view = glGetUniformLocation(scene->mesh.program, "u_view");
	scene->mesh.u_projection = glGetUniformLocation(scene->mesh.program, "u_projection");
}